

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_SENSE_OBJECTS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  _Bool objects;
  effect_handler_context_t_conflict *context_local;
  
  _Var1 = sense_stuff(context,tval_is_not_money,unknown_item_kind);
  if (_Var1) {
    msg("You sense the presence of objects!");
  }
  else if ((context->aware & 1U) != 0) {
    msg("You sense no objects.");
  }
  player->upkeep->redraw = player->upkeep->redraw | 0x800000;
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_SENSE_OBJECTS(effect_handler_context_t *context)
{
	bool objects = sense_stuff(context, tval_is_not_money,
		unknown_item_kind);

	if (objects) {
		msg("You sense the presence of objects!");
	} else if (context->aware) {
		msg("You sense no objects.");
	}

	/* Redraw object list */
	player->upkeep->redraw |= PR_ITEMLIST;

	context->ident = true;
	return true;
}